

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_edison_fab_c.c
# Opt level: O0

mraa_board_t * mraa_intel_edison_fab_c(void)

{
  int iVar1;
  mraa_boolean_t mVar2;
  mraa_result_t mVar3;
  mraa_board_t *b_00;
  mraa_adv_func_t *pmVar4;
  mraa_pininfo_t *pmVar5;
  char *pcVar6;
  int local_210;
  int local_20c;
  int il;
  int ici;
  mraa_pincapabilities_t local_200;
  mraa_pincapabilities_t local_1fc;
  mraa_pincapabilities_t local_1f8;
  mraa_pincapabilities_t local_1f4;
  mraa_pincapabilities_t local_1f0;
  mraa_pincapabilities_t local_1ec;
  mraa_pincapabilities_t local_1e8;
  mraa_pincapabilities_t local_1e4;
  mraa_pincapabilities_t local_1e0;
  mraa_pincapabilities_t local_1dc;
  mraa_pincapabilities_t local_1d8;
  mraa_pincapabilities_t local_1d4;
  mraa_pincapabilities_t local_1d0;
  mraa_pincapabilities_t local_1cc;
  mraa_pincapabilities_t local_1c8;
  mraa_pincapabilities_t local_1c4;
  mraa_pincapabilities_t local_1c0;
  mraa_pincapabilities_t local_1bc;
  mraa_board_t *b;
  undefined4 local_1a8;
  int ret;
  int release;
  int minor;
  int major;
  utsname name;
  mraa_gpio_dir_t tristate_dir;
  
  b_00 = (mraa_board_t *)calloc(1,0x5f0);
  if (b_00 != (mraa_board_t *)0x0) {
    b_00->platform_name = "Intel Edison";
    iVar1 = uname((utsname *)((long)&minor + 2));
    if (iVar1 == 0) {
      b._4_4_ = __isoc99_sscanf(name.nodename + 0x39,"%d.%d.%d",&release,&ret,&local_1a8);
      if (b._4_4_ == 2) {
        b._4_4_ = 3;
        local_1a8 = 0;
      }
      if (1 < b._4_4_) {
        if (3 < release) {
          vanilla_kernel = 1;
          syslog(5,"edison: Linux version 4 or higher detected, assuming Vanilla kernel");
        }
        mVar2 = is_arduino_board();
        if (mVar2 == 0) {
          syslog(5,"edison: Arduino board not detected, assuming Intel Edison Miniboard");
          mVar3 = mraa_intel_edison_miniboard(b_00);
          if (mVar3 == MRAA_SUCCESS) {
            return b_00;
          }
        }
        else {
          b_00->phy_pin_count = 0x14;
          b_00->gpio_count = 0xe;
          b_00->aio_count = 6;
          b_00->platform_version = "arduino";
          pmVar4 = (mraa_adv_func_t *)calloc(1,0x288);
          b_00->adv_func = pmVar4;
          if (b_00->adv_func != (mraa_adv_func_t *)0x0) {
            b_00->adv_func->gpio_dir_pre = mraa_intel_edison_gpio_dir_pre;
            b_00->adv_func->gpio_init_post = mraa_intel_edison_gpio_init_post;
            b_00->adv_func->gpio_close_pre = mraa_intel_edison_gpio_close_pre;
            b_00->adv_func->gpio_dir_post = mraa_intel_edison_gpio_dir_post;
            b_00->adv_func->i2c_init_pre = mraa_intel_edison_i2c_init_pre;
            b_00->adv_func->i2c_set_frequency_replace = mraa_intel_edison_i2c_freq;
            b_00->adv_func->aio_get_valid_fp = mraa_intel_edison_aio_get_fp;
            b_00->adv_func->aio_init_pre = mraa_intel_edison_aio_init_pre;
            b_00->adv_func->aio_init_post = mraa_intel_edison_aio_init_post;
            b_00->adv_func->pwm_init_pre = mraa_intel_edison_pwm_init_pre;
            b_00->adv_func->pwm_init_post = mraa_intel_edison_pwm_init_post;
            b_00->adv_func->pwm_enable_pre = mraa_intel_edison_pwm_enable_pre;
            b_00->adv_func->pwm_write_pre = mraa_intel_edison_pwm_write_pre;
            b_00->adv_func->spi_init_pre = mraa_intel_edison_spi_init_pre;
            b_00->adv_func->spi_init_post = mraa_intel_edison_spi_init_post;
            b_00->adv_func->gpio_mode_replace = mraa_intel_edison_gpio_mode_replace;
            b_00->adv_func->uart_init_pre = mraa_intel_edison_uart_init_pre;
            b_00->adv_func->uart_init_post = mraa_intel_edison_uart_init_post;
            b_00->adv_func->gpio_mmap_setup = mraa_intel_edison_mmap_setup;
            b_00->adv_func->spi_lsbmode_replace = mraa_intel_edison_spi_lsbmode_replace;
            pmVar5 = (mraa_pininfo_t *)calloc(0x19,0x2f4);
            b_00->pins = pmVar5;
            if (b_00->pins == (mraa_pininfo_t *)0x0) {
              free(b_00->adv_func);
            }
            else {
              mVar3 = mraa_gpio_read_dir(tristate,(mraa_gpio_dir_t *)(name.__domainname + 0x39));
              if (mVar3 == MRAA_SUCCESS) {
                if (name.__domainname._57_4_ != 0) {
                  mraa_gpio_dir(tristate,MRAA_GPIO_OUT);
                }
                mraa_intel_edison_misc_spi();
                b_00->adc_raw = 0xc;
                b_00->adc_supported = 10;
                b_00->pwm_default_period = 5000;
                b_00->pwm_max_period = 0x35555;
                b_00->pwm_min_period = 1;
                strncpy(b_00->pins->name,"IO0",8);
                local_1bc = (mraa_pincapabilities_t)(CONCAT31(local_1bc._1_3_,3) | 0x80);
                b_00->pins->capabilities = local_1bc;
                (b_00->pins->gpio).pinmap = 0x82;
                (b_00->pins->gpio).parent_id = 0;
                (b_00->pins->gpio).mux_total = 1;
                (b_00->pins->gpio).mux[0].pincmd = 2;
                (b_00->pins->gpio).mux[0].pin = 0xd8;
                (b_00->pins->gpio).mux[0].value = 1;
                (b_00->pins->uart).pinmap = 0;
                (b_00->pins->uart).parent_id = 0;
                (b_00->pins->uart).mux_total = 0;
                strncpy(b_00->pins[1].name,"IO1",8);
                local_1c0 = (mraa_pincapabilities_t)(CONCAT31(local_1c0._1_3_,3) | 0x80);
                b_00->pins[1].capabilities = local_1c0;
                b_00->pins[1].gpio.pinmap = 0x83;
                b_00->pins[1].gpio.parent_id = 0;
                b_00->pins[1].gpio.mux_total = 1;
                b_00->pins[1].gpio.mux[0].pincmd = 2;
                b_00->pins[1].gpio.mux[0].pin = 0xd9;
                b_00->pins[1].gpio.mux[0].value = 1;
                b_00->pins[1].uart.pinmap = 0;
                b_00->pins[1].uart.parent_id = 0;
                b_00->pins[1].uart.mux_total = 0;
                strncpy(b_00->pins[2].name,"IO2",8);
                local_1c4._0_1_ = 3;
                b_00->pins[2].capabilities = local_1c4;
                b_00->pins[2].gpio.pinmap = 0x80;
                b_00->pins[2].gpio.parent_id = 0;
                b_00->pins[2].gpio.mux_total = 1;
                b_00->pins[2].gpio.mux[0].pincmd = 2;
                b_00->pins[2].gpio.mux[0].pin = 0xda;
                b_00->pins[2].gpio.mux[0].value = 1;
                strncpy(b_00->pins[3].name,"IO3",8);
                local_1c8 = (mraa_pincapabilities_t)(CONCAT31(local_1c8._1_3_,3) | 4);
                b_00->pins[3].capabilities = local_1c8;
                b_00->pins[3].gpio.pinmap = 0xc;
                b_00->pins[3].gpio.parent_id = 0;
                b_00->pins[3].gpio.mux_total = 1;
                b_00->pins[3].gpio.mux[0].pincmd = 2;
                b_00->pins[3].gpio.mux[0].pin = 0xdb;
                b_00->pins[3].gpio.mux[0].value = 1;
                b_00->pins[3].pwm.pinmap = 0;
                b_00->pins[3].pwm.parent_id = 0;
                b_00->pins[3].pwm.mux_total = 0;
                strncpy(b_00->pins[4].name,"IO4",8);
                local_1cc._0_1_ = 3;
                b_00->pins[4].capabilities = local_1cc;
                b_00->pins[4].gpio.pinmap = 0x81;
                b_00->pins[4].gpio.parent_id = 0;
                b_00->pins[4].gpio.mux_total = 1;
                b_00->pins[4].gpio.mux[0].pincmd = 2;
                b_00->pins[4].gpio.mux[0].pin = 0xdc;
                b_00->pins[4].gpio.mux[0].value = 1;
                strncpy(b_00->pins[5].name,"IO5",8);
                local_1d0 = (mraa_pincapabilities_t)(CONCAT31(local_1d0._1_3_,3) | 4);
                b_00->pins[5].capabilities = local_1d0;
                b_00->pins[5].gpio.pinmap = 0xd;
                b_00->pins[5].gpio.parent_id = 0;
                b_00->pins[5].gpio.mux_total = 1;
                b_00->pins[5].gpio.mux[0].pincmd = 2;
                b_00->pins[5].gpio.mux[0].pin = 0xdd;
                b_00->pins[5].gpio.mux[0].value = 1;
                b_00->pins[5].pwm.pinmap = 1;
                b_00->pins[5].pwm.parent_id = 0;
                b_00->pins[5].pwm.mux_total = 0;
                strncpy(b_00->pins[6].name,"IO6",8);
                local_1d4 = (mraa_pincapabilities_t)(CONCAT31(local_1d4._1_3_,3) | 4);
                b_00->pins[6].capabilities = local_1d4;
                b_00->pins[6].gpio.pinmap = 0xb6;
                b_00->pins[6].gpio.parent_id = 0;
                b_00->pins[6].gpio.mux_total = 1;
                b_00->pins[6].gpio.mux[0].pincmd = 2;
                b_00->pins[6].gpio.mux[0].pin = 0xde;
                b_00->pins[6].gpio.mux[0].value = 1;
                b_00->pins[6].pwm.pinmap = 2;
                b_00->pins[6].pwm.parent_id = 0;
                b_00->pins[6].pwm.mux_total = 0;
                strncpy(b_00->pins[7].name,"IO7",8);
                local_1d8._0_1_ = 3;
                b_00->pins[7].capabilities = local_1d8;
                b_00->pins[7].gpio.pinmap = 0x30;
                b_00->pins[7].gpio.parent_id = 0;
                b_00->pins[7].gpio.mux_total = 1;
                b_00->pins[7].gpio.mux[0].pincmd = 2;
                b_00->pins[7].gpio.mux[0].pin = 0xdf;
                b_00->pins[7].gpio.mux[0].value = 1;
                strncpy(b_00->pins[8].name,"IO8",8);
                local_1dc._0_1_ = 3;
                b_00->pins[8].capabilities = local_1dc;
                b_00->pins[8].gpio.pinmap = 0x31;
                b_00->pins[8].gpio.parent_id = 0;
                b_00->pins[8].gpio.mux_total = 1;
                b_00->pins[8].gpio.mux[0].pincmd = 2;
                b_00->pins[8].gpio.mux[0].pin = 0xe0;
                b_00->pins[8].gpio.mux[0].value = 1;
                strncpy(b_00->pins[9].name,"IO9",8);
                local_1e0 = (mraa_pincapabilities_t)(CONCAT31(local_1e0._1_3_,3) | 4);
                b_00->pins[9].capabilities = local_1e0;
                b_00->pins[9].gpio.pinmap = 0xb7;
                b_00->pins[9].gpio.parent_id = 0;
                b_00->pins[9].gpio.mux_total = 1;
                b_00->pins[9].gpio.mux[0].pincmd = 2;
                b_00->pins[9].gpio.mux[0].pin = 0xe1;
                b_00->pins[9].gpio.mux[0].value = 1;
                b_00->pins[9].pwm.pinmap = 3;
                b_00->pins[9].pwm.parent_id = 0;
                b_00->pins[9].pwm.mux_total = 0;
                strncpy(b_00->pins[10].name,"IO10",8);
                local_1e4 = (mraa_pincapabilities_t)(CONCAT31(local_1e4._1_3_,3) | 0x10);
                b_00->pins[10].capabilities = local_1e4;
                b_00->pins[10].gpio.pinmap = 0x29;
                b_00->pins[10].gpio.parent_id = 0;
                b_00->pins[10].gpio.mux_total = 3;
                b_00->pins[10].gpio.mux[0].pincmd = 2;
                b_00->pins[10].gpio.mux[0].pin = 0xe2;
                b_00->pins[10].gpio.mux[0].value = 1;
                b_00->pins[10].gpio.mux[1].pincmd = 4;
                b_00->pins[10].gpio.mux[1].pin = 0x107;
                b_00->pins[10].gpio.mux[1].value = 1;
                b_00->pins[10].gpio.mux[2].pincmd = 4;
                b_00->pins[10].gpio.mux[2].pin = 0xf0;
                b_00->pins[10].gpio.mux[2].value = 0;
                b_00->pins[10].spi.pinmap = 5;
                b_00->pins[10].spi.mux_total = 3;
                b_00->pins[10].spi.mux[0].pincmd = 2;
                b_00->pins[10].spi.mux[0].pin = 0xe2;
                b_00->pins[10].spi.mux[0].value = 1;
                b_00->pins[10].spi.mux[1].pincmd = 4;
                b_00->pins[10].spi.mux[1].pin = 0x107;
                b_00->pins[10].spi.mux[1].value = 1;
                b_00->pins[10].spi.mux[2].pincmd = 4;
                b_00->pins[10].spi.mux[2].pin = 0xf0;
                b_00->pins[10].spi.mux[2].value = 1;
                strncpy(b_00->pins[0xb].name,"IO11",8);
                local_1e8 = (mraa_pincapabilities_t)(CONCAT31(local_1e8._1_3_,3) | 0x10);
                b_00->pins[0xb].capabilities = local_1e8;
                b_00->pins[0xb].gpio.pinmap = 0x2b;
                b_00->pins[0xb].gpio.parent_id = 0;
                b_00->pins[0xb].gpio.mux_total = 3;
                b_00->pins[0xb].gpio.mux[0].pincmd = 2;
                b_00->pins[0xb].gpio.mux[0].pin = 0xe3;
                b_00->pins[0xb].gpio.mux[0].value = 1;
                b_00->pins[0xb].gpio.mux[1].pincmd = 4;
                b_00->pins[0xb].gpio.mux[1].pin = 0x106;
                b_00->pins[0xb].gpio.mux[1].value = 1;
                b_00->pins[0xb].gpio.mux[2].pincmd = 4;
                b_00->pins[0xb].gpio.mux[2].pin = 0xf1;
                b_00->pins[0xb].gpio.mux[2].value = 0;
                b_00->pins[0xb].spi.pinmap = 5;
                b_00->pins[0xb].spi.mux_total = 3;
                b_00->pins[0xb].spi.mux[0].pincmd = 2;
                b_00->pins[0xb].spi.mux[0].pin = 0xe3;
                b_00->pins[0xb].spi.mux[0].value = 1;
                b_00->pins[10].spi.mux[1].pincmd = 4;
                b_00->pins[0xb].spi.mux[1].pin = 0x106;
                b_00->pins[0xb].spi.mux[1].value = 1;
                b_00->pins[10].spi.mux[2].pincmd = 4;
                b_00->pins[0xb].spi.mux[2].pin = 0xf1;
                b_00->pins[0xb].spi.mux[2].value = 1;
                strncpy(b_00->pins[0xc].name,"IO12",8);
                local_1ec = (mraa_pincapabilities_t)(CONCAT31(local_1ec._1_3_,3) | 0x10);
                b_00->pins[0xc].capabilities = local_1ec;
                b_00->pins[0xc].gpio.pinmap = 0x2a;
                b_00->pins[0xc].gpio.parent_id = 0;
                b_00->pins[0xc].gpio.mux_total = 2;
                b_00->pins[0xc].gpio.mux[0].pincmd = 2;
                b_00->pins[0xc].gpio.mux[0].pin = 0xe4;
                b_00->pins[0xc].gpio.mux[0].value = 1;
                b_00->pins[0xc].gpio.mux[1].pincmd = 4;
                b_00->pins[0xc].gpio.mux[1].pin = 0xf2;
                b_00->pins[0xc].gpio.mux[1].value = 0;
                b_00->pins[0xc].spi.pinmap = 5;
                b_00->pins[0xc].spi.mux_total = 2;
                b_00->pins[0xc].spi.mux[0].pincmd = 2;
                b_00->pins[0xc].spi.mux[0].pin = 0xe4;
                b_00->pins[0xc].spi.mux[0].value = 1;
                b_00->pins[0xc].spi.mux[1].pincmd = 4;
                b_00->pins[0xc].spi.mux[1].pin = 0xf2;
                b_00->pins[0xc].spi.mux[1].value = 1;
                strncpy(b_00->pins[0xd].name,"IO13",8);
                local_1f0 = (mraa_pincapabilities_t)(CONCAT31(local_1f0._1_3_,3) | 0x10);
                b_00->pins[0xd].capabilities = local_1f0;
                b_00->pins[0xd].gpio.pinmap = 0x28;
                b_00->pins[0xd].gpio.parent_id = 0;
                b_00->pins[0xd].gpio.mux_total = 2;
                b_00->pins[0xd].gpio.mux[0].pincmd = 2;
                b_00->pins[0xd].gpio.mux[0].pin = 0xe5;
                b_00->pins[0xd].gpio.mux[0].value = 1;
                b_00->pins[0xd].gpio.mux[1].pincmd = 4;
                b_00->pins[0xd].gpio.mux[1].pin = 0xf3;
                b_00->pins[0xd].gpio.mux[1].value = 0;
                b_00->pins[0xd].spi.pinmap = 5;
                b_00->pins[0xd].spi.mux_total = 2;
                b_00->pins[0xd].spi.mux[0].pincmd = 2;
                b_00->pins[0xd].spi.mux[0].pin = 0xe5;
                b_00->pins[0xd].spi.mux[0].value = 1;
                b_00->pins[0xd].spi.mux[1].pincmd = 4;
                b_00->pins[0xd].spi.mux[1].pin = 0xf3;
                b_00->pins[0xd].spi.mux[1].value = 1;
                strncpy(b_00->pins[0xe].name,"A0",8);
                local_1f4 = (mraa_pincapabilities_t)(CONCAT31(local_1f4._1_3_,3) | 0x40);
                b_00->pins[0xe].capabilities = local_1f4;
                b_00->pins[0xe].aio.pinmap = 0;
                b_00->pins[0xe].aio.mux_total = 2;
                b_00->pins[0xe].aio.mux[0].pincmd = 2;
                b_00->pins[0xe].aio.mux[0].pin = 0xd0;
                b_00->pins[0xe].aio.mux[0].value = 1;
                b_00->pins[0xe].aio.mux[1].pincmd = 4;
                b_00->pins[0xe].aio.mux[1].pin = 200;
                b_00->pins[0xe].aio.mux[1].value = 1;
                b_00->pins[0xe].gpio.pinmap = 0x2c;
                b_00->pins[0xe].gpio.mux_total = 2;
                b_00->pins[0xe].gpio.mux[0].pincmd = 2;
                b_00->pins[0xe].gpio.mux[0].pin = 0xd0;
                b_00->pins[0xe].gpio.mux[0].value = 1;
                b_00->pins[0xe].gpio.mux[1].pincmd = 4;
                b_00->pins[0xe].gpio.mux[1].pin = 200;
                b_00->pins[0xe].gpio.mux[1].value = 0;
                strncpy(b_00->pins[0xf].name,"A1",8);
                local_1f8 = (mraa_pincapabilities_t)(CONCAT31(local_1f8._1_3_,3) | 0x40);
                b_00->pins[0xf].capabilities = local_1f8;
                b_00->pins[0xf].aio.pinmap = 1;
                b_00->pins[0xf].aio.mux_total = 2;
                b_00->pins[0xf].aio.mux[0].pincmd = 2;
                b_00->pins[0xf].aio.mux[0].pin = 0xd1;
                b_00->pins[0xf].aio.mux[0].value = 1;
                b_00->pins[0xf].aio.mux[1].pincmd = 4;
                b_00->pins[0xf].aio.mux[1].pin = 0xc9;
                b_00->pins[0xf].aio.mux[1].value = 1;
                b_00->pins[0xf].gpio.pinmap = 0x2d;
                b_00->pins[0xf].gpio.mux_total = 2;
                b_00->pins[0xf].gpio.mux[0].pincmd = 2;
                b_00->pins[0xf].gpio.mux[0].pin = 0xd1;
                b_00->pins[0xf].gpio.mux[0].value = 1;
                b_00->pins[0xf].gpio.mux[1].pincmd = 4;
                b_00->pins[0xf].gpio.mux[1].pin = 0xc9;
                b_00->pins[0xf].gpio.mux[1].value = 0;
                strncpy(b_00->pins[0x10].name,"A2",8);
                local_1fc = (mraa_pincapabilities_t)(CONCAT31(local_1fc._1_3_,3) | 0x40);
                b_00->pins[0x10].capabilities = local_1fc;
                b_00->pins[0x10].aio.pinmap = 2;
                b_00->pins[0x10].aio.mux_total = 2;
                b_00->pins[0x10].aio.mux[0].pincmd = 2;
                b_00->pins[0x10].aio.mux[0].pin = 0xd2;
                b_00->pins[0x10].aio.mux[0].value = 1;
                b_00->pins[0x10].aio.mux[1].pincmd = 4;
                b_00->pins[0x10].aio.mux[1].pin = 0xca;
                b_00->pins[0x10].aio.mux[1].value = 1;
                b_00->pins[0x10].gpio.pinmap = 0x2e;
                b_00->pins[0x10].gpio.mux_total = 2;
                b_00->pins[0x10].gpio.mux[0].pincmd = 2;
                b_00->pins[0x10].gpio.mux[0].pin = 0xd2;
                b_00->pins[0x10].gpio.mux[0].value = 1;
                b_00->pins[0x10].gpio.mux[1].pincmd = 4;
                b_00->pins[0x10].gpio.mux[1].pin = 0xca;
                b_00->pins[0x10].gpio.mux[1].value = 0;
                strncpy(b_00->pins[0x11].name,"A3",8);
                local_200 = (mraa_pincapabilities_t)(CONCAT31(local_200._1_3_,3) | 0x40);
                b_00->pins[0x11].capabilities = local_200;
                b_00->pins[0x11].aio.pinmap = 3;
                b_00->pins[0x11].aio.mux_total = 2;
                b_00->pins[0x11].aio.mux[0].pincmd = 2;
                b_00->pins[0x11].aio.mux[0].pin = 0xd3;
                b_00->pins[0x11].aio.mux[0].value = 1;
                b_00->pins[0x11].aio.mux[1].pincmd = 4;
                b_00->pins[0x11].aio.mux[1].pin = 0xcb;
                b_00->pins[0x11].aio.mux[1].value = 1;
                b_00->pins[0x11].gpio.pinmap = 0x2f;
                b_00->pins[0x11].gpio.mux_total = 2;
                b_00->pins[0x11].gpio.mux[0].pincmd = 2;
                b_00->pins[0x11].gpio.mux[0].pin = 0xd3;
                b_00->pins[0x11].gpio.mux[0].value = 1;
                b_00->pins[0x11].gpio.mux[1].pincmd = 4;
                b_00->pins[0x11].gpio.mux[1].pin = 0xcb;
                b_00->pins[0x11].gpio.mux[1].value = 0;
                strncpy(b_00->pins[0x12].name,"A4",8);
                ici = CONCAT31(ici._1_3_,3) | 0x60;
                b_00->pins[0x12].capabilities = (mraa_pincapabilities_t)ici;
                b_00->pins[0x12].i2c.pinmap = 1;
                b_00->pins[0x12].i2c.mux_total = 2;
                b_00->pins[0x12].i2c.mux[0].pincmd = 2;
                b_00->pins[0x12].i2c.mux[0].pin = 0xd4;
                b_00->pins[0x12].i2c.mux[0].value = 1;
                b_00->pins[0x12].i2c.mux[1].pincmd = 4;
                b_00->pins[0x12].i2c.mux[1].pin = 0xcc;
                b_00->pins[0x12].i2c.mux[1].value = 0;
                b_00->pins[0x12].aio.pinmap = 4;
                b_00->pins[0x12].aio.mux_total = 2;
                b_00->pins[0x12].aio.mux[0].pincmd = 2;
                b_00->pins[0x12].aio.mux[0].pin = 0xd4;
                b_00->pins[0x12].aio.mux[0].value = 1;
                b_00->pins[0x12].aio.mux[1].pincmd = 4;
                b_00->pins[0x12].aio.mux[1].pin = 0xcc;
                b_00->pins[0x12].aio.mux[1].value = 1;
                b_00->pins[0x12].gpio.pinmap = 0xe;
                b_00->pins[0x12].gpio.mux_total = 2;
                b_00->pins[0x12].gpio.mux[0].pincmd = 2;
                b_00->pins[0x12].gpio.mux[0].pin = 0xd4;
                b_00->pins[0x12].gpio.mux[0].value = 1;
                b_00->pins[0x12].gpio.mux[1].pincmd = 4;
                b_00->pins[0x12].gpio.mux[1].pin = 0xcc;
                b_00->pins[0x12].gpio.mux[1].value = 0;
                strncpy(b_00->pins[0x13].name,"A5",8);
                il = CONCAT31(il._1_3_,3) | 0x60;
                b_00->pins[0x13].capabilities = (mraa_pincapabilities_t)il;
                b_00->pins[0x13].i2c.pinmap = 1;
                b_00->pins[0x13].i2c.mux_total = 2;
                b_00->pins[0x13].i2c.mux[0].pincmd = 2;
                b_00->pins[0x13].i2c.mux[0].pin = 0xd5;
                b_00->pins[0x13].i2c.mux[0].value = 1;
                b_00->pins[0x13].i2c.mux[1].pincmd = 4;
                b_00->pins[0x13].i2c.mux[1].pin = 0xcd;
                b_00->pins[0x13].i2c.mux[1].value = 0;
                b_00->pins[0x13].aio.pinmap = 5;
                b_00->pins[0x13].aio.mux_total = 2;
                b_00->pins[0x12].aio.mux[0].pincmd = 2;
                b_00->pins[0x12].aio.mux[0].pin = 0xd5;
                b_00->pins[0x12].aio.mux[0].value = 1;
                b_00->pins[0x12].aio.mux[1].pincmd = 4;
                b_00->pins[0x13].aio.mux[1].pin = 0xcd;
                b_00->pins[0x13].aio.mux[1].value = 1;
                b_00->pins[0x13].gpio.pinmap = 0xa5;
                b_00->pins[0x13].gpio.mux_total = 2;
                b_00->pins[0x13].gpio.mux[0].pincmd = 2;
                b_00->pins[0x13].gpio.mux[0].pin = 0xd5;
                b_00->pins[0x13].gpio.mux[0].value = 1;
                b_00->pins[0x13].gpio.mux[1].pincmd = 4;
                b_00->pins[0x13].gpio.mux[1].pin = 0xcd;
                b_00->pins[0x13].gpio.mux[1].value = 0;
                b_00->i2c_bus_count = 9;
                b_00->def_i2c_bus = 6;
                for (local_20c = 0; local_20c < 9; local_20c = local_20c + 1) {
                  b_00->i2c_bus[local_20c].bus_id = -1;
                }
                b_00->i2c_bus[6].bus_id = 6;
                b_00->i2c_bus[6].sda = 0x12;
                b_00->i2c_bus[6].scl = 0x13;
                b_00->spi_bus_count = 1;
                b_00->def_spi_bus = 0;
                b_00->spi_bus[0].bus_id = 5;
                b_00->spi_bus[0].slave_s = 1;
                b_00->spi_bus[0].cs = 10;
                b_00->spi_bus[0].mosi = 0xb;
                b_00->spi_bus[0].miso = 0xc;
                b_00->spi_bus[0].sclk = 0xd;
                b_00->uart_dev_count = 1;
                b_00->def_uart_dev = 0;
                b_00->uart_dev[0].rx = 0;
                b_00->uart_dev[0].tx = 1;
                pcVar6 = "/dev/ttyS1";
                if (vanilla_kernel == 0) {
                  pcVar6 = "/dev/ttyMFD1";
                }
                b_00->uart_dev[0].device_path = pcVar6;
                for (local_210 = 0; local_210 < 0x19; local_210 = local_210 + 1) {
                  pinmodes[local_210].gpio.sysfs = -1;
                  pinmodes[local_210].gpio.mode = -1;
                  pinmodes[local_210].pwm.sysfs = -1;
                  pinmodes[local_210].pwm.mode = -1;
                  pinmodes[local_210].i2c.sysfs = -1;
                  pinmodes[local_210].i2c.mode = -1;
                  pinmodes[local_210].spi.sysfs = -1;
                  pinmodes[local_210].spi.mode = -1;
                  pinmodes[local_210].uart.sysfs = -1;
                  pinmodes[local_210].uart.mode = -1;
                }
                pinmodes[0].gpio.sysfs = 0x82;
                pinmodes[0].gpio.mode = 0;
                pinmodes[0].uart.sysfs = 0x82;
                pinmodes[0].uart.mode = 1;
                pinmodes[1].gpio.sysfs = 0x83;
                pinmodes[1].gpio.mode = 0;
                pinmodes[1].uart.sysfs = 0x83;
                pinmodes[1].uart.mode = 1;
                pinmodes[2].gpio.sysfs = 0x80;
                pinmodes[2].gpio.mode = 0;
                pinmodes[2].uart.sysfs = 0x80;
                pinmodes[2].uart.mode = 1;
                pinmodes[3].gpio.sysfs = 0xc;
                pinmodes[3].gpio.mode = 0;
                pinmodes[3].pwm.sysfs = 0xc;
                pinmodes[3].pwm.mode = 1;
                pinmodes[4].gpio.sysfs = 0x81;
                pinmodes[4].gpio.mode = 0;
                pinmodes[4].uart.sysfs = 0x81;
                pinmodes[4].uart.mode = 1;
                pinmodes[5].gpio.sysfs = 0xd;
                pinmodes[5].gpio.mode = 0;
                pinmodes[5].pwm.sysfs = 0xd;
                pinmodes[5].pwm.mode = 1;
                pinmodes[6].gpio.sysfs = 0xb6;
                pinmodes[6].gpio.mode = 0;
                pinmodes[6].pwm.sysfs = 0xb6;
                pinmodes[6].pwm.mode = 1;
                pinmodes[9].gpio.sysfs = 0xb7;
                pinmodes[9].gpio.mode = 0;
                pinmodes[9].pwm.sysfs = 0xb7;
                pinmodes[9].pwm.mode = 1;
                pinmodes[10].gpio.sysfs = 0x29;
                pinmodes[10].gpio.mode = 0;
                pinmodes[10].spi.sysfs = 0x6f;
                pinmodes[10].spi.mode = 1;
                pinmodes[0xb].gpio.sysfs = 0x2b;
                pinmodes[0xb].gpio.mode = 0;
                pinmodes[0xb].spi.sysfs = 0x73;
                pinmodes[0xb].spi.mode = 1;
                pinmodes[0xc].gpio.sysfs = 0x2a;
                pinmodes[0xc].gpio.mode = 0;
                pinmodes[0xc].spi.sysfs = 0x72;
                pinmodes[0xc].spi.mode = 1;
                pinmodes[0xd].gpio.sysfs = 0x28;
                pinmodes[0xd].gpio.mode = 0;
                pinmodes[0xd].spi.sysfs = 0x6d;
                pinmodes[0xd].spi.mode = 1;
                pinmodes[0x12].gpio.sysfs = 0xe;
                pinmodes[0x12].gpio.mode = 0;
                pinmodes[0x12].i2c.sysfs = 0x1c;
                pinmodes[0x12].i2c.mode = 1;
                pinmodes[0x13].gpio.sysfs = 0xa5;
                pinmodes[0x13].gpio.mode = 0;
                pinmodes[0x13].i2c.sysfs = 0x1b;
                pinmodes[0x13].i2c.mode = 1;
                return b_00;
              }
              free(b_00->pins);
              free(b_00->adv_func);
            }
          }
        }
      }
    }
    syslog(2,"edison: Arduino board failed to initialise");
    free(b_00);
  }
  return (mraa_board_t *)0x0;
}

Assistant:

mraa_board_t*
mraa_intel_edison_fab_c()
{
    mraa_gpio_dir_t tristate_dir;
    struct utsname name;
    int major, minor, release;
    int ret;
    mraa_board_t* b = (mraa_board_t*) calloc(1, sizeof(mraa_board_t));
    if (b == NULL) {
        return NULL;
    }

    b->platform_name = PLATFORM_NAME;

    if (uname(&name) != 0) {
        goto error;
    }

    ret = sscanf(name.release, "%d.%d.%d", &major, &minor, &release);
    if (ret == 2) {
        ret++;
        release = 0;
    }
    if (ret < 2) {
        goto error;
    }

    if (major >= 4) {
        vanilla_kernel = 1;
        syslog(LOG_NOTICE,
               "edison: Linux version 4 or higher detected, assuming Vanilla kernel");
    };

    if (is_arduino_board() == 0) {
        syslog(LOG_NOTICE,
               "edison: Arduino board not detected, assuming Intel Edison Miniboard");
        if (mraa_intel_edison_miniboard(b) != MRAA_SUCCESS) {
            goto error;
        }
        return b;
    }
    // Now Assuming the edison is attached to the Arduino board.
    b->phy_pin_count = 20;
    b->gpio_count = 14;
    b->aio_count = 6;
    b->platform_version = "arduino";

    b->adv_func = (mraa_adv_func_t*) calloc(1, sizeof(mraa_adv_func_t));
    if (b->adv_func == NULL) {
        goto error;
    }
    b->adv_func->gpio_dir_pre = &mraa_intel_edison_gpio_dir_pre;
    b->adv_func->gpio_init_post = &mraa_intel_edison_gpio_init_post;
    b->adv_func->gpio_close_pre = &mraa_intel_edison_gpio_close_pre;
    b->adv_func->gpio_dir_post = &mraa_intel_edison_gpio_dir_post;
    b->adv_func->i2c_init_pre = &mraa_intel_edison_i2c_init_pre;
    b->adv_func->i2c_set_frequency_replace = &mraa_intel_edison_i2c_freq;
    b->adv_func->aio_get_valid_fp = &mraa_intel_edison_aio_get_fp;
    b->adv_func->aio_init_pre = &mraa_intel_edison_aio_init_pre;
    b->adv_func->aio_init_post = &mraa_intel_edison_aio_init_post;
    b->adv_func->pwm_init_pre = &mraa_intel_edison_pwm_init_pre;
    b->adv_func->pwm_init_post = &mraa_intel_edison_pwm_init_post;
    b->adv_func->pwm_enable_pre = &mraa_intel_edison_pwm_enable_pre;
    b->adv_func->pwm_write_pre = &mraa_intel_edison_pwm_write_pre;
    b->adv_func->spi_init_pre = &mraa_intel_edison_spi_init_pre;
    b->adv_func->spi_init_post = &mraa_intel_edison_spi_init_post;
    b->adv_func->gpio_mode_replace = &mraa_intel_edison_gpio_mode_replace;
    b->adv_func->uart_init_pre = &mraa_intel_edison_uart_init_pre;
    b->adv_func->uart_init_post = &mraa_intel_edison_uart_init_post;
    b->adv_func->gpio_mmap_setup = &mraa_intel_edison_mmap_setup;
    b->adv_func->spi_lsbmode_replace = &mraa_intel_edison_spi_lsbmode_replace;

    b->pins = (mraa_pininfo_t*) calloc(MRAA_INTEL_EDISON_PINCOUNT, sizeof(mraa_pininfo_t));
    if (b->pins == NULL) {
        free(b->adv_func);
        goto error;
    }

    if (mraa_gpio_read_dir(tristate, &tristate_dir) != MRAA_SUCCESS) {
        free(b->pins);
        free(b->adv_func);
        goto error;
    }

    if (tristate_dir != MRAA_GPIO_OUT) {
        mraa_gpio_dir(tristate, MRAA_GPIO_OUT);
    }

    // this is required to initialise not just SPI but also the ADC channels
    mraa_intel_edison_misc_spi();

    b->adc_raw = 12;
    b->adc_supported = 10;
    b->pwm_default_period = 5000;
    b->pwm_max_period = 218453;
    b->pwm_min_period = 1;

    strncpy(b->pins[0].name, "IO0", 8);
    b->pins[0].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 1 };
    b->pins[0].gpio.pinmap = 130;
    b->pins[0].gpio.parent_id = 0;
    b->pins[0].gpio.mux_total = 1;
    b->pins[0].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[0].gpio.mux[0].pin = 216;
    b->pins[0].gpio.mux[0].value = MRAA_GPIO_IN;
    b->pins[0].uart.pinmap = 0;
    b->pins[0].uart.parent_id = 0;
    b->pins[0].uart.mux_total = 0;

    strncpy(b->pins[1].name, "IO1", 8);
    b->pins[1].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 1 };
    b->pins[1].gpio.pinmap = 131;
    b->pins[1].gpio.parent_id = 0;
    b->pins[1].gpio.mux_total = 1;
    b->pins[1].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[1].gpio.mux[0].pin = 217;
    b->pins[1].gpio.mux[0].value = MRAA_GPIO_IN;
    b->pins[1].uart.pinmap = 0;
    b->pins[1].uart.parent_id = 0;
    b->pins[1].uart.mux_total = 0;

    strncpy(b->pins[2].name, "IO2", 8);
    b->pins[2].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[2].gpio.pinmap = 128;
    b->pins[2].gpio.parent_id = 0;
    b->pins[2].gpio.mux_total = 1;
    b->pins[2].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[2].gpio.mux[0].pin = 218;
    b->pins[2].gpio.mux[0].value = MRAA_GPIO_IN;

    strncpy(b->pins[3].name, "IO3", 8);
    b->pins[3].capabilities = (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 };
    b->pins[3].gpio.pinmap = 12;
    b->pins[3].gpio.parent_id = 0;
    b->pins[3].gpio.mux_total = 1;
    b->pins[3].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[3].gpio.mux[0].pin = 219;
    b->pins[3].gpio.mux[0].value = MRAA_GPIO_IN;
    b->pins[3].pwm.pinmap = 0;
    b->pins[3].pwm.parent_id = 0;
    b->pins[3].pwm.mux_total = 0;

    strncpy(b->pins[4].name, "IO4", 8);
    b->pins[4].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[4].gpio.pinmap = 129;
    b->pins[4].gpio.parent_id = 0;
    b->pins[4].gpio.mux_total = 1;
    b->pins[4].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[4].gpio.mux[0].pin = 220;
    b->pins[4].gpio.mux[0].value = MRAA_GPIO_IN;

    strncpy(b->pins[5].name, "IO5", 8);
    b->pins[5].capabilities = (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 };
    b->pins[5].gpio.pinmap = 13;
    b->pins[5].gpio.parent_id = 0;
    b->pins[5].gpio.mux_total = 1;
    b->pins[5].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[5].gpio.mux[0].pin = 221;
    b->pins[5].gpio.mux[0].value = MRAA_GPIO_IN;
    b->pins[5].pwm.pinmap = 1;
    b->pins[5].pwm.parent_id = 0;
    b->pins[5].pwm.mux_total = 0;

    strncpy(b->pins[6].name, "IO6", 8);
    b->pins[6].capabilities = (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 };
    b->pins[6].gpio.pinmap = 182;
    b->pins[6].gpio.parent_id = 0;
    b->pins[6].gpio.mux_total = 1;
    b->pins[6].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[6].gpio.mux[0].pin = 222;
    b->pins[6].gpio.mux[0].value = MRAA_GPIO_IN;
    b->pins[6].pwm.pinmap = 2;
    b->pins[6].pwm.parent_id = 0;
    b->pins[6].pwm.mux_total = 0;

    strncpy(b->pins[7].name, "IO7", 8);
    b->pins[7].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[7].gpio.pinmap = 48;
    b->pins[7].gpio.parent_id = 0;
    b->pins[7].gpio.mux_total = 1;
    b->pins[7].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[7].gpio.mux[0].pin = 223;
    b->pins[7].gpio.mux[0].value = MRAA_GPIO_IN;

    strncpy(b->pins[8].name, "IO8", 8);
    b->pins[8].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[8].gpio.pinmap = 49;
    b->pins[8].gpio.parent_id = 0;
    b->pins[8].gpio.mux_total = 1;
    b->pins[8].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[8].gpio.mux[0].pin = 224;
    b->pins[8].gpio.mux[0].value = MRAA_GPIO_IN;

    strncpy(b->pins[9].name, "IO9", 8);
    b->pins[9].capabilities = (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 };
    b->pins[9].gpio.pinmap = 183;
    b->pins[9].gpio.parent_id = 0;
    b->pins[9].gpio.mux_total = 1;
    b->pins[9].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[9].gpio.mux[0].pin = 225;
    b->pins[9].gpio.mux[0].value = MRAA_GPIO_IN;
    b->pins[9].pwm.pinmap = 3;
    b->pins[9].pwm.parent_id = 0;
    b->pins[9].pwm.mux_total = 0;

    strncpy(b->pins[10].name, "IO10", 8);
    b->pins[10].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 1, 0, 0, 0 };
    b->pins[10].gpio.pinmap = 41;
    b->pins[10].gpio.parent_id = 0;
    b->pins[10].gpio.mux_total = 3;
    b->pins[10].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[10].gpio.mux[0].pin = 226;
    b->pins[10].gpio.mux[0].value = MRAA_GPIO_IN;
    b->pins[10].gpio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[10].gpio.mux[1].pin = 263;
    b->pins[10].gpio.mux[1].value = 1;
    b->pins[10].gpio.mux[2].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[10].gpio.mux[2].pin = 240;
    b->pins[10].gpio.mux[2].value = 0;
    b->pins[10].spi.pinmap = 5;
    b->pins[10].spi.mux_total = 3;
    b->pins[10].spi.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[10].spi.mux[0].pin = 226;
    b->pins[10].spi.mux[0].value = MRAA_GPIO_IN;
    b->pins[10].spi.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[10].spi.mux[1].pin = 263;
    b->pins[10].spi.mux[1].value = 1;
    b->pins[10].spi.mux[2].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[10].spi.mux[2].pin = 240;
    b->pins[10].spi.mux[2].value = 1;

    strncpy(b->pins[11].name, "IO11", 8);
    b->pins[11].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 1, 0, 0, 0 };
    b->pins[11].gpio.pinmap = 43;
    b->pins[11].gpio.parent_id = 0;
    b->pins[11].gpio.mux_total = 3;
    b->pins[11].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[11].gpio.mux[0].pin = 227;
    b->pins[11].gpio.mux[0].value = MRAA_GPIO_IN;
    b->pins[11].gpio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[11].gpio.mux[1].pin = 262;
    b->pins[11].gpio.mux[1].value = 1;
    b->pins[11].gpio.mux[2].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[11].gpio.mux[2].pin = 241;
    b->pins[11].gpio.mux[2].value = 0;
    b->pins[11].spi.pinmap = 5;
    b->pins[11].spi.mux_total = 3;
    b->pins[11].spi.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[11].spi.mux[0].pin = 227;
    b->pins[11].spi.mux[0].value = MRAA_GPIO_IN;
    b->pins[10].spi.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[11].spi.mux[1].pin = 262;
    b->pins[11].spi.mux[1].value = 1;
    b->pins[10].spi.mux[2].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[11].spi.mux[2].pin = 241;
    b->pins[11].spi.mux[2].value = 1;

    strncpy(b->pins[12].name, "IO12", 8);
    b->pins[12].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 1, 0, 0, 0 };
    b->pins[12].gpio.pinmap = 42;
    b->pins[12].gpio.parent_id = 0;
    b->pins[12].gpio.mux_total = 2;
    b->pins[12].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[12].gpio.mux[0].pin = 228;
    b->pins[12].gpio.mux[0].value = MRAA_GPIO_IN;
    b->pins[12].gpio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[12].gpio.mux[1].pin = 242;
    b->pins[12].gpio.mux[1].value = 0;
    b->pins[12].spi.pinmap = 5;
    b->pins[12].spi.mux_total = 2;
    b->pins[12].spi.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[12].spi.mux[0].pin = 228;
    b->pins[12].spi.mux[0].value = MRAA_GPIO_IN;
    b->pins[12].spi.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[12].spi.mux[1].pin = 242;
    b->pins[12].spi.mux[1].value = 1;

    strncpy(b->pins[13].name, "IO13", 8);
    b->pins[13].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 1, 0, 0, 0 };
    b->pins[13].gpio.pinmap = 40;
    b->pins[13].gpio.parent_id = 0;
    b->pins[13].gpio.mux_total = 2;
    b->pins[13].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[13].gpio.mux[0].pin = 229;
    b->pins[13].gpio.mux[0].value = MRAA_GPIO_IN;
    b->pins[13].gpio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[13].gpio.mux[1].pin = 243;
    b->pins[13].gpio.mux[1].value = 0;
    b->pins[13].spi.pinmap = 5;
    b->pins[13].spi.mux_total = 2;
    b->pins[13].spi.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[13].spi.mux[0].pin = 229;
    b->pins[13].spi.mux[0].value = MRAA_GPIO_IN;
    b->pins[13].spi.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[13].spi.mux[1].pin = 243;
    b->pins[13].spi.mux[1].value = 1;

    strncpy(b->pins[14].name, "A0", 8);
    b->pins[14].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 1, 0 };
    b->pins[14].aio.pinmap = 0;
    b->pins[14].aio.mux_total = 2;
    b->pins[14].aio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[14].aio.mux[0].pin = 208;
    b->pins[14].aio.mux[0].value = MRAA_GPIO_IN;
    b->pins[14].aio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[14].aio.mux[1].pin = 200;
    b->pins[14].aio.mux[1].value = 1;
    b->pins[14].gpio.pinmap = 44;
    b->pins[14].gpio.mux_total = 2;
    b->pins[14].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[14].gpio.mux[0].pin = 208;
    b->pins[14].gpio.mux[0].value = MRAA_GPIO_IN;
    b->pins[14].gpio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[14].gpio.mux[1].pin = 200;
    b->pins[14].gpio.mux[1].value = 0;

    strncpy(b->pins[15].name, "A1", 8);
    b->pins[15].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 1, 0 };
    b->pins[15].aio.pinmap = 1;
    b->pins[15].aio.mux_total = 2;
    b->pins[15].aio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[15].aio.mux[0].pin = 209;
    b->pins[15].aio.mux[0].value = MRAA_GPIO_IN;
    b->pins[15].aio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[15].aio.mux[1].pin = 201;
    b->pins[15].aio.mux[1].value = 1;
    b->pins[15].gpio.pinmap = 45;
    b->pins[15].gpio.mux_total = 2;
    b->pins[15].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[15].gpio.mux[0].pin = 209;
    b->pins[15].gpio.mux[0].value = MRAA_GPIO_IN;
    b->pins[15].gpio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[15].gpio.mux[1].pin = 201;
    b->pins[15].gpio.mux[1].value = 0;

    strncpy(b->pins[16].name, "A2", 8);
    b->pins[16].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 1, 0 };
    b->pins[16].aio.pinmap = 2;
    b->pins[16].aio.mux_total = 2;
    b->pins[16].aio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[16].aio.mux[0].pin = 210;
    b->pins[16].aio.mux[0].value = MRAA_GPIO_IN;
    b->pins[16].aio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[16].aio.mux[1].pin = 202;
    b->pins[16].aio.mux[1].value = 1;
    b->pins[16].gpio.pinmap = 46;
    b->pins[16].gpio.mux_total = 2;
    b->pins[16].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[16].gpio.mux[0].pin = 210;
    b->pins[16].gpio.mux[0].value = MRAA_GPIO_IN;
    b->pins[16].gpio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[16].gpio.mux[1].pin = 202;
    b->pins[16].gpio.mux[1].value = 0;

    strncpy(b->pins[17].name, "A3", 8);
    b->pins[17].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 1, 0 };
    b->pins[17].aio.pinmap = 3;
    b->pins[17].aio.mux_total = 2;
    b->pins[17].aio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[17].aio.mux[0].pin = 211;
    b->pins[17].aio.mux[0].value = MRAA_GPIO_IN;
    b->pins[17].aio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[17].aio.mux[1].pin = 203;
    b->pins[17].aio.mux[1].value = 1;
    b->pins[17].gpio.pinmap = 47;
    b->pins[17].gpio.mux_total = 2;
    b->pins[17].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[17].gpio.mux[0].pin = 211;
    b->pins[17].gpio.mux[0].value = MRAA_GPIO_IN;
    b->pins[17].gpio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[17].gpio.mux[1].pin = 203;
    b->pins[17].gpio.mux[1].value = 0;

    strncpy(b->pins[18].name, "A4", 8);
    b->pins[18].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 1, 1, 0 };
    b->pins[18].i2c.pinmap = 1;
    b->pins[18].i2c.mux_total = 2;
    b->pins[18].i2c.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[18].i2c.mux[0].pin = 212;
    b->pins[18].i2c.mux[0].value = MRAA_GPIO_IN;
    b->pins[18].i2c.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[18].i2c.mux[1].pin = 204;
    b->pins[18].i2c.mux[1].value = 0;
    b->pins[18].aio.pinmap = 4;
    b->pins[18].aio.mux_total = 2;
    b->pins[18].aio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[18].aio.mux[0].pin = 212;
    b->pins[18].aio.mux[0].value = MRAA_GPIO_IN;
    b->pins[18].aio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[18].aio.mux[1].pin = 204;
    b->pins[18].aio.mux[1].value = 1;
    b->pins[18].gpio.pinmap = 14;
    b->pins[18].gpio.mux_total = 2;
    b->pins[18].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[18].gpio.mux[0].pin = 212;
    b->pins[18].gpio.mux[0].value = MRAA_GPIO_IN;
    b->pins[18].gpio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[18].gpio.mux[1].pin = 204;
    b->pins[18].gpio.mux[1].value = 0;

    strncpy(b->pins[19].name, "A5", 8);
    b->pins[19].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 1, 1, 0 };
    b->pins[19].i2c.pinmap = 1;
    b->pins[19].i2c.mux_total = 2;
    b->pins[19].i2c.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[19].i2c.mux[0].pin = 213;
    b->pins[19].i2c.mux[0].value = MRAA_GPIO_IN;
    b->pins[19].i2c.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[19].i2c.mux[1].pin = 205;
    b->pins[19].i2c.mux[1].value = 0;
    b->pins[19].aio.pinmap = 5;
    b->pins[19].aio.mux_total = 2;
    b->pins[18].aio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[18].aio.mux[0].pin = 213;
    b->pins[18].aio.mux[0].value = MRAA_GPIO_IN;
    b->pins[18].aio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[19].aio.mux[1].pin = 205;
    b->pins[19].aio.mux[1].value = 1;
    b->pins[19].gpio.pinmap = 165;
    b->pins[19].gpio.mux_total = 2;
    b->pins[19].gpio.mux[0].pincmd = PINCMD_SET_DIRECTION;
    b->pins[19].gpio.mux[0].pin = 213;
    b->pins[19].gpio.mux[0].value = MRAA_GPIO_IN;
    b->pins[19].gpio.mux[1].pincmd = PINCMD_SET_OUT_VALUE;
    b->pins[19].gpio.mux[1].pin = 205;
    b->pins[19].gpio.mux[1].value = 0;

    // BUS DEFINITIONS
    b->i2c_bus_count = 9;
    b->def_i2c_bus = 6;
    int ici;
    for (ici = 0; ici < 9; ici++) {
        b->i2c_bus[ici].bus_id = -1;
    }
    b->i2c_bus[6].bus_id = 6;
    b->i2c_bus[6].sda = 18;
    b->i2c_bus[6].scl = 19;

    b->spi_bus_count = 1;
    b->def_spi_bus = 0;
    b->spi_bus[0].bus_id = 5;
    b->spi_bus[0].slave_s = 1;
    b->spi_bus[0].cs = 10;
    b->spi_bus[0].mosi = 11;
    b->spi_bus[0].miso = 12;
    b->spi_bus[0].sclk = 13;

    b->uart_dev_count = 1;
    b->def_uart_dev = 0;
    b->uart_dev[0].rx = 0;
    b->uart_dev[0].tx = 1;
    b->uart_dev[0].device_path = UART_DEV_PATH;

    int il;
    for (il = 0; il < MRAA_INTEL_EDISON_PINCOUNT; il++) {
        pinmodes[il].gpio.sysfs = -1;
        pinmodes[il].gpio.mode = -1;
        pinmodes[il].pwm.sysfs = -1;
        pinmodes[il].pwm.mode = -1;
        pinmodes[il].i2c.sysfs = -1;
        pinmodes[il].i2c.mode = -1;
        pinmodes[il].spi.sysfs = -1;
        pinmodes[il].spi.mode = -1;
        pinmodes[il].uart.sysfs = -1;
        pinmodes[il].uart.mode = -1;
    }
    pinmodes[0].gpio.sysfs = 130;
    pinmodes[0].gpio.mode = 0;
    pinmodes[0].uart.sysfs = 130;
    pinmodes[0].uart.mode = 1;
    pinmodes[1].gpio.sysfs = 131;
    pinmodes[1].gpio.mode = 0;
    pinmodes[1].uart.sysfs = 131;
    pinmodes[1].uart.mode = 1;
    pinmodes[2].gpio.sysfs = 128;
    pinmodes[2].gpio.mode = 0;
    pinmodes[2].uart.sysfs = 128;
    pinmodes[2].uart.mode = 1;
    pinmodes[3].gpio.sysfs = 12;
    pinmodes[3].gpio.mode = 0;
    pinmodes[3].pwm.sysfs = 12;
    pinmodes[3].pwm.mode = 1;

    pinmodes[4].gpio.sysfs = 129;
    pinmodes[4].gpio.mode = 0;
    pinmodes[4].uart.sysfs = 129;
    pinmodes[4].uart.mode = 1;
    pinmodes[5].gpio.sysfs = 13;
    pinmodes[5].gpio.mode = 0;
    pinmodes[5].pwm.sysfs = 13;
    pinmodes[5].pwm.mode = 1;
    pinmodes[6].gpio.sysfs = 182;
    pinmodes[6].gpio.mode = 0;
    pinmodes[6].pwm.sysfs = 182;
    pinmodes[6].pwm.mode = 1;

    // 7 and 8 are provided by something on i2c, very simple

    pinmodes[9].gpio.sysfs = 183;
    pinmodes[9].gpio.mode = 0;
    pinmodes[9].pwm.sysfs = 183;
    pinmodes[9].pwm.mode = 1;

    pinmodes[10].gpio.sysfs = 41;
    pinmodes[10].gpio.mode = 0;
    pinmodes[10].spi.sysfs = 111; // Different pin provides, switched at mux level.
    pinmodes[10].spi.mode = 1;

    pinmodes[11].gpio.sysfs = 43;
    pinmodes[11].gpio.mode = 0;
    pinmodes[11].spi.sysfs = 115; // Different pin provides, switched at mux level.
    pinmodes[11].spi.mode = 1;

    pinmodes[12].gpio.sysfs = 42;
    pinmodes[12].gpio.mode = 0;
    pinmodes[12].spi.sysfs = 114; // Different pin provides, switched at mux level.
    pinmodes[12].spi.mode = 1;

    pinmodes[13].gpio.sysfs = 40;
    pinmodes[13].gpio.mode = 0;
    pinmodes[13].spi.sysfs = 109; // Different pin provides, switched at mux level.
    pinmodes[13].spi.mode = 1;

    // Everything else but A4 A5 LEAVE

    pinmodes[18].gpio.sysfs = 14;
    pinmodes[18].gpio.mode = 0;
    pinmodes[18].i2c.sysfs = 28;
    pinmodes[18].i2c.mode = 1;

    pinmodes[19].gpio.sysfs = 165;
    pinmodes[19].gpio.mode = 0;
    pinmodes[19].i2c.sysfs = 27;
    pinmodes[19].i2c.mode = 1;

    return b;
error:
    syslog(LOG_CRIT, "edison: Arduino board failed to initialise");
    free(b);
    return NULL;
}